

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

void __thiscall cbtDbvt::update(cbtDbvt *this,cbtDbvtNode *leaf,cbtDbvtVolume *volume)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  cbtDbvtNode *pcVar4;
  int iVar5;
  cbtDbvtNode *root;
  
  pcVar4 = removeleaf(this,leaf);
  if (pcVar4 == (cbtDbvtNode *)0x0) {
    root = (cbtDbvtNode *)0x0;
  }
  else if (this->m_lkhd < 0) {
    root = this->m_root;
  }
  else {
    iVar5 = this->m_lkhd + 1;
    do {
      root = pcVar4;
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) break;
      pcVar4 = root->parent;
    } while (root->parent != (cbtDbvtNode *)0x0);
  }
  uVar1 = *(undefined8 *)((volume->mi).m_floats + 2);
  uVar2 = *(undefined8 *)(volume->mx).m_floats;
  uVar3 = *(undefined8 *)((volume->mx).m_floats + 2);
  *(undefined8 *)(leaf->volume).mi.m_floats = *(undefined8 *)(volume->mi).m_floats;
  *(undefined8 *)((leaf->volume).mi.m_floats + 2) = uVar1;
  *(undefined8 *)(leaf->volume).mx.m_floats = uVar2;
  *(undefined8 *)((leaf->volume).mx.m_floats + 2) = uVar3;
  insertleaf(this,root,leaf);
  return;
}

Assistant:

void cbtDbvt::update(cbtDbvtNode* leaf, cbtDbvtVolume& volume)
{
	cbtDbvtNode* root = removeleaf(this, leaf);
	if (root)
	{
		if (m_lkhd >= 0)
		{
			for (int i = 0; (i < m_lkhd) && root->parent; ++i)
			{
				root = root->parent;
			}
		}
		else
			root = m_root;
	}
	leaf->volume = volume;
	insertleaf(this, root, leaf);
}